

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockWidgetGroupLayout::takeAt(QDockWidgetGroupLayout *this,int index)

{
  QDockAreaLayoutInfo *this_00;
  int iVar1;
  QLayoutItem *pQVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long in_FS_OFFSET;
  int x;
  QArrayDataPointer<int> local_60;
  QArrayDataPointer<int> local_48;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  this_00 = &this->layoutState;
  pQVar2 = QDockAreaLayoutInfo::takeAt(this_00,&local_2c,index);
  if (((this->savedState).rect.x1.m_i <= (this->savedState).rect.x2.m_i) &&
     ((this->savedState).rect.y1.m_i <= (this->savedState).rect.y2.m_i)) {
    iVar1 = (*pQVar2->_vptr_QLayoutItem[0xd])(pQVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d._0_4_ = 0xaaaaaaaa;
      local_48.d._4_4_ = 0xaaaaaaaa;
      local_48.ptr._0_4_ = 0xaaaaaaaa;
      local_48.ptr._4_4_ = 0xaaaaaaaa;
      iVar1 = (*pQVar2->_vptr_QLayoutItem[0xd])(pQVar2);
      QDockAreaLayoutInfo::indexOf
                ((QList<int> *)&local_48,&this->savedState,
                 (QWidget *)CONCAT44(extraout_var_00,iVar1));
      if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
        QDockAreaLayoutInfo::remove(&this->savedState,(char *)&local_48);
      }
      iVar1 = (*pQVar2->_vptr_QLayoutItem[0xd])(pQVar2);
      QDockAreaLayoutInfo::indexOf
                ((QList<int> *)&local_60,this_00,(QWidget *)CONCAT44(extraout_var_01,iVar1));
      QArrayDataPointer<int>::operator=(&local_48,&local_60);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
      if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
        QDockAreaLayoutInfo::remove(this_00,(char *)&local_48);
      }
      QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* takeAt(int index) override
    {
        int x = 0;
        QLayoutItem *ret = layoutState.takeAt(&x, index);
        if (savedState.rect.isValid() && ret->widget()) {
            // we need to remove the item also from the saved state to prevent crash
            QList<int> path = savedState.indexOf(ret->widget());
            if (!path.isEmpty())
                savedState.remove(path);
            // Also, the item may be contained several times as a gap item.
            path = layoutState.indexOf(ret->widget());
            if (!path.isEmpty())
                layoutState.remove(path);
        }
        return ret;
    }